

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

statusline checkhttpprefix(Curl_easy *data,char *s,size_t len)

{
  curl_slist *pcVar1;
  _Bool _Var2;
  statusline sVar3;
  curl_slist **ppcVar4;
  
  ppcVar4 = &(data->set).http200aliases;
  sVar3 = STATUS_BAD;
  do {
    pcVar1 = *ppcVar4;
    if (pcVar1 == (curl_slist *)0x0) goto LAB_004bd470;
    _Var2 = checkprefixmax(pcVar1->data,s,len);
    ppcVar4 = &pcVar1->next;
  } while (!_Var2);
  sVar3 = STATUS_UNKNOWN;
  if (len < 5) {
LAB_004bd470:
    _Var2 = checkprefixmax("HTTP/",s,len);
    if (_Var2) {
      sVar3 = (uint)(4 < len);
    }
  }
  else {
    sVar3 = STATUS_DONE;
  }
  return sVar3;
}

Assistant:

static statusline
checkhttpprefix(struct Curl_easy *data,
                const char *s, size_t len)
{
  struct curl_slist *head = data->set.http200aliases;
  statusline rc = STATUS_BAD;
  statusline onmatch = len >= 5? STATUS_DONE : STATUS_UNKNOWN;

  while(head) {
    if(checkprefixmax(head->data, s, len)) {
      rc = onmatch;
      break;
    }
    head = head->next;
  }

  if((rc != STATUS_DONE) && (checkprefixmax("HTTP/", s, len)))
    rc = onmatch;

  return rc;
}